

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *this_00;
  int iVar1;
  bool bVar2;
  TestSuite *pTVar3;
  TestSuite *new_test_suite;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  UnitTestFilter death_test_suite_filter;
  allocator local_e1;
  TestSuite *local_e0;
  string local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [40];
  UnitTestFilter local_80;
  
  local_b8._8_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8._0_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::__cxx11::string::string((string *)&local_80,test_suite_name,(allocator *)&local_d8);
  std::__cxx11::string::string((string *)(local_a8 + 8),(string *)&local_80);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)local_a8,
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)(local_b8 + 8),(TestSuiteNameIs *)local_b8);
  this_00 = &this->test_suites_;
  std::__cxx11::string::~string((string *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)&local_80);
  if ((pointer)local_a8._0_8_ ==
      (this_00->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    pTVar3 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite(pTVar3,test_suite_name,type_param,set_up_tc,tear_down_tc);
    local_e0 = pTVar3;
    std::__cxx11::string::string((string *)&local_d8,"*DeathTest:*DeathTest/*",&local_e1);
    anon_unknown_36::UnitTestFilter::UnitTestFilter(&local_80,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string((string *)&local_d8,test_suite_name,&local_e1);
    bVar2 = anon_unknown_36::UnitTestFilter::MatchesName(&local_80,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if (bVar2) {
      iVar1 = this->last_death_test_suite_;
      this->last_death_test_suite_ = iVar1 + 1;
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                (this_00,(const_iterator)
                         ((this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar1 + 1),&local_e0);
    }
    else {
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::push_back
                (this_00,&local_e0);
    }
    local_d8._M_dataplus._M_p._0_4_ =
         (undefined4)
         ((ulong)((long)(this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&this->test_suite_indices_,(int *)&local_d8);
    pTVar3 = local_e0;
    anon_unknown_36::UnitTestFilter::~UnitTestFilter(&local_80);
  }
  else {
    pTVar3 = *(pointer)(local_a8._0_8_ - 8);
  }
  return pTVar3;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  const UnitTestFilter death_test_suite_filter(kDeathTestSuiteFilter);
  // Is this a death test suite?
  if (death_test_suite_filter.MatchesName(test_suite_name)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}